

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O0

Vec_Int_t * Sbc_ManDetectMult(Gia_Man_t *p,Vec_Int_t *vIns)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Wrd_t *pVVar3;
  int *piVar4;
  bool bVar5;
  word local_888;
  Vec_Mem_t *local_860;
  Vec_Mem_t *vTtMem;
  word Temp;
  word *pInfoObj;
  word R [128];
  word B [64];
  word A [64];
  int nIns;
  int Entry;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vGia2Out;
  int nWords;
  Vec_Int_t *vIns_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_IntStartFull(iVar1);
  iVar1 = Vec_IntSize(vIns);
  iVar1 = iVar1 / 2;
  local_860 = Vec_MemAlloc(1,10);
  Vec_MemHashAlloc(local_860,1000);
  Sbc_SimMult(B + 0x3f,R + 0x7f,(word *)&pInfoObj,iVar1);
  for (nIns = 0; SBORROW4(nIns,iVar1 * 2) != nIns + iVar1 * -2 < 0; nIns = nIns + 1) {
    Vec_MemHashInsert(local_860,R + (long)nIns + -1);
  }
  iVar2 = Vec_MemEntryNum(local_860);
  if (iVar2 != iVar1 * 2) {
    __assert_fail("Vec_MemEntryNum(vTtMem) == 2*nIns",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                  ,0x16e,"Vec_Int_t *Sbc_ManDetectMult(Gia_Man_t *, Vec_Int_t *)");
  }
  Vec_WrdFreeP(&p->vSims);
  iVar2 = Gia_ManObjNum(p);
  pVVar3 = Vec_WrdStart(iVar2);
  p->vSims = pVVar3;
  p->nSimWords = 1;
  Gia_ManIncrementTravId(p);
  Gia_ObjSetTravIdCurrentId(p,0);
  nIns = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->vCis);
    bVar5 = false;
    if (nIns < iVar2) {
      _Entry = Gia_ManCi(p,nIns);
      bVar5 = _Entry != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    Gia_ObjSetTravIdCurrent(p,_Entry);
    nIns = nIns + 1;
  }
  iVar2 = Vec_IntSize(vIns);
  if (iVar2 % 2 != 0) {
    __assert_fail("Vec_IntSize(vIns) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                  ,0x17f,"Vec_Int_t *Sbc_ManDetectMult(Gia_Man_t *, Vec_Int_t *)");
  }
  nIns = 0;
  while( true ) {
    iVar2 = Vec_IntSize(vIns);
    bVar5 = false;
    if (nIns < iVar2) {
      iVar2 = Vec_IntEntry(vIns,nIns);
      _Entry = Gia_ManObj(p,iVar2);
      bVar5 = _Entry != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    Gia_ObjSetTravIdCurrent(p,_Entry);
    iVar2 = Gia_ObjId(p,_Entry);
    Temp = (word)Wlc_ObjSim(p,iVar2);
    if (nIns < iVar1) {
      local_888 = B[(long)nIns + 0x3f];
    }
    else {
      local_888 = R[(long)(nIns - iVar1) + 0x7f];
    }
    *(word *)Temp = local_888;
    nIns = nIns + 1;
  }
  nIns = 1;
  while( true ) {
    bVar5 = false;
    if (nIns < p->nObjs) {
      _Entry = Gia_ManObj(p,nIns);
      bVar5 = _Entry != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsTravIdCurrent(p,_Entry);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(_Entry);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCo(_Entry);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                        ,0x191,"Vec_Int_t *Sbc_ManDetectMult(Gia_Man_t *, Vec_Int_t *)");
        }
        Wlc_ObjSimCo(p,nIns);
      }
      else {
        Wlc_ObjSimAnd(p,nIns);
      }
      Temp = (word)Wlc_ObjSim(p,nIns);
      piVar4 = Vec_MemHashLookup(local_860,(word *)Temp);
      if (*piVar4 < 0) {
        vTtMem = *(Vec_Mem_t **)Temp;
        Abc_TtNot((word *)Temp,1);
        piVar4 = Vec_MemHashLookup(local_860,(word *)Temp);
        iVar1 = *piVar4;
        Abc_TtNot((word *)Temp,1);
        if (vTtMem != *(Vec_Mem_t **)Temp) {
          __assert_fail("Temp == *pInfoObj",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                        ,0x1a1,"Vec_Int_t *Sbc_ManDetectMult(Gia_Man_t *, Vec_Int_t *)");
        }
        if (-1 < iVar1) {
          iVar1 = Abc_Var2Lit(iVar1,1);
          Vec_IntWriteEntry(p_00,nIns,iVar1);
        }
      }
      else {
        iVar1 = Abc_Var2Lit(*piVar4,0);
        Vec_IntWriteEntry(p_00,nIns,iVar1);
      }
    }
    nIns = nIns + 1;
  }
  nIns = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar5 = false;
    if (nIns < iVar1) {
      _Entry = Gia_ManCo(p,nIns);
      bVar5 = _Entry != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjId(p,_Entry);
    Temp = (word)Wlc_ObjSim(p,iVar1);
    nIns = nIns + 1;
  }
  Vec_MemHashFree(local_860);
  Vec_MemFreeP(&local_860);
  return p_00;
}

Assistant:

Vec_Int_t * Sbc_ManDetectMult( Gia_Man_t * p, Vec_Int_t * vIns )
{
    int nWords = 1;
    Vec_Int_t * vGia2Out = Vec_IntStartFull( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj; int i, Entry, nIns = Vec_IntSize(vIns)/2;
    word A[64], B[64], R[128], * pInfoObj; word Temp;

    // create hash table
    Vec_Mem_t * vTtMem = Vec_MemAlloc( nWords, 10 );
    Vec_MemHashAlloc( vTtMem, 1000 );
    Sbc_SimMult( A, B, R, nIns );
    for ( i = 0; i < 2*nIns; i++ )
    {
        Vec_MemHashInsert( vTtMem, R+i );
        //printf( "Out %2d : ", i );
        //Extra_PrintHex( stdout, (unsigned *)(R+i), 6 ); printf( "\n" );
    }
    assert( Vec_MemEntryNum(vTtMem) == 2*nIns );

    // alloc simulation info
    Vec_WrdFreeP( &p->vSims );
    p->vSims = Vec_WrdStart( Gia_ManObjNum(p) * nWords );
    p->nSimWords = nWords;

    // mark inputs
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrentId( p, 0 );
    Gia_ManForEachCi( p, pObj, i )
    {
        Gia_ObjSetTravIdCurrent( p, pObj );
        //Wlc_ObjSimPi( p, Gia_ObjId(p, pObj) );
    }

    // assign inputs
    assert( Vec_IntSize(vIns) % 2 == 0 );
    Gia_ManForEachObjVec( vIns, p, pObj, i )
    {
        Gia_ObjSetTravIdCurrent( p, pObj );
        pInfoObj = Wlc_ObjSim( p, Gia_ObjId(p, pObj) );
        *pInfoObj = i < nIns ? A[i] : B[i - nIns];
    }

    // perform simulation
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsTravIdCurrent(p, pObj) )
            continue;

        if ( Gia_ObjIsAnd(pObj) )
            Wlc_ObjSimAnd( p, i );
        else if ( Gia_ObjIsCo(pObj) )
            Wlc_ObjSimCo( p, i );
        else assert( 0 );

        // mark direct polarity
        pInfoObj = Wlc_ObjSim( p, i );
        Entry = *Vec_MemHashLookup( vTtMem, pInfoObj );
        if ( Entry >= 0 )
        {
            Vec_IntWriteEntry( vGia2Out, i, Abc_Var2Lit(Entry, 0) );
            continue;
        }

        // mark negated polarity
        Temp = *pInfoObj;
        Abc_TtNot( pInfoObj, nWords );
        Entry = *Vec_MemHashLookup( vTtMem, pInfoObj );
        Abc_TtNot( pInfoObj, nWords );
        assert( Temp == *pInfoObj );
        if ( Entry >= 0 )
        {
            Vec_IntWriteEntry( vGia2Out, i, Abc_Var2Lit(Entry, 1) );
            continue;
        }
    }

    Gia_ManForEachCo( p, pObj, i )
    {
        pInfoObj = Wlc_ObjSim( p, Gia_ObjId(p, pObj) );
        //printf( "Out %2d : Driver = %5d(%d)", i, Gia_ObjFaninId0p(p, pObj), Gia_ObjFaninC0(pObj) );
        //Extra_PrintHex( stdout, (unsigned *)pInfoObj, 6 ); printf( "\n" );
    }

    // cleanup
    Vec_MemHashFree( vTtMem );
    Vec_MemFreeP( &vTtMem );
    //Vec_WrdFreeP( &p->vSims );
    //p->nSimWords = 0;
    return vGia2Out;
}